

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O0

void __thiscall WithBlock::~WithBlock(WithBlock *this)

{
  size_type_conflict sVar1;
  reference ppCVar2;
  int local_14;
  int4 i;
  WithBlock *this_local;
  
  if (this->pateq != (PatternEquation *)0x0) {
    PatternEquation::release((PatternEquation *)this->pateq);
  }
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<ContextChange_*,_std::allocator<ContextChange_*>_>::size(&this->contvec);
    if (sVar1 <= (ulong)(long)local_14) break;
    ppCVar2 = std::vector<ContextChange_*,_std::allocator<ContextChange_*>_>::operator[]
                        (&this->contvec,(long)local_14);
    if (*ppCVar2 != (value_type)0x0) {
      (**(code **)(*(long *)*ppCVar2 + 8))();
    }
    local_14 = local_14 + 1;
  }
  std::vector<ContextChange_*,_std::allocator<ContextChange_*>_>::~vector(&this->contvec);
  return;
}

Assistant:

WithBlock::~WithBlock(void)

{
  if (pateq != (PatternEquation *)0)
    PatternEquation::release(pateq);
  for(int4 i=0;i<contvec.size();++i) {
    delete contvec[i];
  }
}